

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::CampaignManager::Open(CampaignManager *this,string *name,UserOptions *options)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ostream *poVar4;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Campaign *opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d0 [7];
  char in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_a0 [12];
  int in_stack_ffffffffffffff6c;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  byte *local_20;
  
  local_20 = (byte *)(in_RDX + 8);
  in_RDI->_M_dataplus = (_Alloc_hider)(*local_20 & 1);
  std::__cxx11::string::operator=((string *)&in_RDI->_M_string_length,(string *)(in_RDX + 0x10));
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,(string *)(local_20 + 0x28))
  ;
  std::__cxx11::string::operator=((string *)&in_RDI[2]._M_string_length,(string *)(local_20 + 0x48))
  ;
  bVar1 = local_20[5];
  bVar2 = local_20[6];
  bVar3 = local_20[7];
  in_RDI->field_0x4 = local_20[4];
  in_RDI->field_0x5 = bVar1;
  in_RDI->field_0x6 = bVar2;
  in_RDI->field_0x7 = bVar3;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff37);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff6c);
  std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::operator=((string *)in_RDI[3].field_2._M_local_buf,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  if (0 < *(int *)&in_RDI->field_0x4) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Campaign Manager ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)&in_RDI[4].field_2);
    poVar4 = std::operator<<(poVar4," Open(");
    poVar4 = std::operator<<(poVar4,(string *)in_RDI[3].field_2._M_local_buf);
    std::operator<<(poVar4,")\n");
  }
  *(undefined1 *)&in_RDI[3]._M_string_length = 1;
  return;
}

Assistant:

void CampaignManager::Open(const std::string &name, const UserOptions &options)
{
    const UserOptions::Campaign &opts = options.campaign;
    m_Options.active = opts.active;
    m_Options.hostname = opts.hostname;
    m_Options.campaignstorepath = opts.campaignstorepath;
    m_Options.cachepath = opts.cachepath;
    m_Options.verbose = opts.verbose;

    m_Name = m_CampaignDir + PathSeparator + name + "_" + std::to_string(m_WriterRank);
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << " Open(" << m_Name << ")\n";
    }
    m_Opened = true;
}